

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O1

int run_test_random_async(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  long lVar6;
  char *extraout_RDX;
  undefined1 *puVar7;
  uv_random_t req;
  undefined1 auStack_3b8 [256];
  undefined1 auStack_2b8 [256];
  code *pcStack_1b8;
  undefined1 auStack_1b0 [256];
  undefined8 uStack_b0;
  undefined1 auStack_98 [144];
  
  iVar2 = (int)auStack_98;
  uVar3 = uv_default_loop();
  lVar6 = 0x100;
  iVar1 = uv_random(uVar3,auStack_98,scratch,0x100,0xffffffff,random_cb);
  if (iVar1 == -0x16) {
    lVar6 = -1;
    iVar2 = (int)auStack_98;
    iVar1 = uv_random(uVar3,auStack_98,scratch,0xffffffffffffffff,0xffffffff,random_cb);
    if (iVar1 != -7) goto LAB_00168df7;
    lVar6 = 0;
    iVar2 = (int)auStack_98;
    iVar1 = uv_random(uVar3,auStack_98,scratch,0,0,random_cb);
    if (iVar1 != 0) goto LAB_00168dfc;
    if (random_cb_called != 0) goto LAB_00168e01;
    iVar2 = 0;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_00168e06;
    if (random_cb_called != 1) goto LAB_00168e0b;
    lVar6 = 0x100;
    iVar2 = (int)auStack_98;
    iVar1 = uv_random(uVar3,auStack_98,scratch,0x100,0,random_cb);
    if (iVar1 != 0) goto LAB_00168e10;
    if (random_cb_called != 1) goto LAB_00168e15;
    iVar2 = 0;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_00168e1a;
    if (random_cb_called != 2) goto LAB_00168e1f;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar2 = 0;
    uv_run(uVar3);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_random_async_cold_1();
LAB_00168df7:
    run_test_random_async_cold_2();
LAB_00168dfc:
    run_test_random_async_cold_3();
LAB_00168e01:
    run_test_random_async_cold_4();
LAB_00168e06:
    run_test_random_async_cold_5();
LAB_00168e0b:
    run_test_random_async_cold_6();
LAB_00168e10:
    run_test_random_async_cold_7();
LAB_00168e15:
    run_test_random_async_cold_8();
LAB_00168e1a:
    run_test_random_async_cold_9();
LAB_00168e1f:
    run_test_random_async_cold_10();
  }
  run_test_random_async_cold_11();
  pcStack_1b8 = (code *)0x168e4b;
  uStack_b0 = uVar3;
  memset(auStack_1b0,0,0x100);
  iVar1 = random_cb_called;
  if (iVar2 == 0) {
    if (extraout_RDX != scratch) goto LAB_00168ec1;
    if (random_cb_called != 0) {
      if (lVar6 == 0x100) {
        pcStack_1b8 = (code *)0x168e82;
        iVar2 = bcmp(scratch,auStack_1b0,0x100);
        if (iVar2 != 0) goto LAB_00168ea8;
        pcStack_1b8 = (code *)0x168e8b;
        random_cb_cold_4();
        goto LAB_00168e8b;
      }
      goto LAB_00168ec6;
    }
LAB_00168e8b:
    if (lVar6 != 0) goto LAB_00168ecb;
    pcStack_1b8 = (code *)0x168ea4;
    iVar2 = bcmp(scratch,auStack_1b0,0x100);
    if (iVar2 == 0) {
LAB_00168ea8:
      random_cb_called = iVar1 + 1;
      return iVar2;
    }
  }
  else {
    pcStack_1b8 = (code *)0x168ec1;
    random_cb_cold_1();
LAB_00168ec1:
    pcStack_1b8 = (code *)0x168ec6;
    random_cb_cold_2();
LAB_00168ec6:
    pcStack_1b8 = (code *)0x168ecb;
    random_cb_cold_3();
LAB_00168ecb:
    pcStack_1b8 = (code *)0x168ed0;
    random_cb_cold_5();
  }
  pcStack_1b8 = run_test_random_sync;
  random_cb_cold_6();
  puVar5 = auStack_3b8;
  puVar7 = (undefined1 *)0x0;
  pcStack_1b8 = (code *)lVar6;
  iVar2 = uv_random(0,0,auStack_3b8,0x100,0xffffffff,0);
  if (iVar2 == -0x16) {
    puVar7 = (undefined1 *)0x0;
    iVar2 = uv_random(0,0,auStack_3b8,0xffffffffffffffff,0xffffffff,0);
    if (iVar2 != -7) goto LAB_00168fc1;
    memset(auStack_3b8,0,0x100);
    puVar7 = (undefined1 *)0x0;
    iVar2 = uv_random(0,0,auStack_3b8,0x100,0,0);
    if (iVar2 != 0) goto LAB_00168fc6;
    memset(auStack_2b8,0,0x100);
    iVar2 = bcmp(auStack_3b8,auStack_2b8,0x100);
    if (iVar2 != 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar5 = (undefined1 *)uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00168fd0;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_00168fc1:
    run_test_random_sync_cold_2();
LAB_00168fc6:
    puVar5 = puVar7;
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_00168fd0:
  run_test_random_sync_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar5,0);
  return iVar2;
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                random_cb));
  ASSERT(UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT(0 == uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT(0 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == random_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}